

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O0

void s98c_write_sync_n(s98c *ctx,uint32_t num)

{
  byte local_15;
  uint local_14;
  uint8_t v;
  uint32_t num_local;
  s98c *ctx_local;
  
  if (num == 1) {
    s98c_write(ctx,0xff);
  }
  else if ((ctx->header).version == 1) {
    s98c_write(ctx,0xfe);
    s98c_write(ctx,(char)num + 0xfe);
  }
  else {
    s98c_write(ctx,0xfe);
    local_14 = num - 2;
    do {
      local_15 = (byte)local_14 & 0x7f;
      local_14 = local_14 >> 7;
      if (local_14 != 0) {
        local_15 = local_15 | 0x80;
      }
      s98c_write(ctx,local_15);
    } while (local_14 != 0);
  }
  return;
}

Assistant:

void s98c_write_sync_n(struct s98c* ctx, uint32_t num)
{
    if(num == 1) {
        s98c_write(ctx, 0xff);
    } else if(ctx->header.version != 1) {
        uint8_t v;

        s98c_write(ctx, 0xfe);
        num -= 2;
        do {
            v = (num & 0x7f);
            num >>= 7;
            if(num != 0) {
                v |= 0x80;
            }
            s98c_write(ctx, v);
        } while(num);
    } else {
        num -= 2;
        s98c_write(ctx, 0xfe);
        s98c_write(ctx, num & 0xff);
    }
}